

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sms_Apu.cpp
# Opt level: O2

void __thiscall Sms_Apu::reset(Sms_Apu *this,uint feedback,int noise_width)

{
  Blip_Buffer *pBVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  bool bVar5;
  
  this->last_time = 0;
  this->latch = 0;
  uVar2 = 9;
  if (feedback != 0 && noise_width != 0) {
    uVar2 = (ulong)feedback;
  }
  iVar4 = 0x10;
  if (feedback != 0 && noise_width != 0) {
    iVar4 = noise_width;
  }
  this->looped_feedback = 1 << ((char)iVar4 - 1U & 0x1f);
  this->noise_feedback = 0;
  uVar3 = 0;
  while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
    uVar3 = ((uint)uVar2 & 1) + uVar3 * 2;
    this->noise_feedback = uVar3;
    uVar2 = uVar2 >> 1;
  }
  this->squares[0].super_Sms_Osc.delay = 0;
  this->squares[0].super_Sms_Osc.last_amp = 0;
  *(undefined8 *)&this->squares[0].super_Sms_Osc.volume = 0;
  this->squares[0].phase = 0;
  this->squares[0].super_Sms_Osc.output_select = 3;
  pBVar1 = this->squares[1].super_Sms_Osc.outputs[3];
  this->squares[0].super_Sms_Osc.output = this->squares[0].super_Sms_Osc.outputs[3];
  this->squares[1].phase = 0;
  this->squares[1].super_Sms_Osc.delay = 0;
  this->squares[1].super_Sms_Osc.last_amp = 0;
  *(undefined8 *)&this->squares[1].super_Sms_Osc.volume = 0;
  this->squares[1].super_Sms_Osc.output_select = 3;
  this->squares[1].super_Sms_Osc.output = pBVar1;
  this->squares[2].super_Sms_Osc.delay = 0;
  this->squares[2].super_Sms_Osc.last_amp = 0;
  *(undefined8 *)&this->squares[2].super_Sms_Osc.volume = 0;
  this->squares[2].phase = 0;
  this->squares[2].super_Sms_Osc.output_select = 3;
  this->squares[2].super_Sms_Osc.output = this->squares[2].super_Sms_Osc.outputs[3];
  Sms_Noise::reset(&this->noise);
  return;
}

Assistant:

void Sms_Apu::reset( unsigned feedback, int noise_width )
{
	last_time = 0;
	latch = 0;
	
	if ( !feedback || !noise_width )
	{
		feedback = 0x0009;
		noise_width = 16;
	}
	// convert to "Galios configuration"
	looped_feedback = 1 << (noise_width - 1);
	noise_feedback  = 0;
	while ( noise_width-- )
	{
		noise_feedback = (noise_feedback << 1) | (feedback & 1);
		feedback >>= 1;
	}
	
	squares [0].reset();
	squares [1].reset();
	squares [2].reset();
	noise.reset();
}